

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithUnsignedLongLongIntegerParameter_Test::testBody
          (TEST_MockExpectedCall_callWithUnsignedLongLongIntegerParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  undefined8 uVar2;
  uint uVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  cpputest_ulonglong cVar7;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  undefined8 local_28;
  unsigned_long_long value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithUnsignedLongLongIntegerParameter_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)&value,"paramName");
  local_28 = 0x378;
  MockExpectedCall::withParameter
            (&((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall,
             (SimpleString *)&value,0x378);
  pUVar4 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(local_48,pMVar1,&value);
  pcVar5 = SimpleString::asCharString(local_48);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"unsigned long long int",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xf2,pTVar6);
  SimpleString::~SimpleString(local_48);
  pUVar4 = UtestShell::getCurrent();
  uVar2 = local_28;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_98,pMVar1,&value);
  cVar7 = MockNamedValue::getUnsignedLongLongIntValue(&local_98);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x11])
            (pUVar4,uVar2,cVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xf3,pTVar6);
  MockNamedValue::~MockNamedValue(&local_98);
  pUVar4 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar3 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,&value);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 & 1),"CHECK","call->hasInputParameterWithName(paramName)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xf4,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_a8);
  pcVar5 = SimpleString::asCharString(&local_a8);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"funcName -> unsigned long long int paramName: <888 (0x378)>",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xf5);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString((SimpleString *)&value);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithUnsignedLongLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    unsigned long long value = 888;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("unsigned long long int", call->getInputParameterType(paramName).asCharString());
    UNSIGNED_LONGLONGS_EQUAL(value, call->getInputParameter(paramName).getUnsignedLongLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> unsigned long long int paramName: <888 (0x378)>", call->callToString().asCharString());
}